

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

int32_t __thiscall DeviceTy::initOnce(DeviceTy *this)

{
  DeviceTy *local_20;
  code *local_18;
  undefined8 local_10;
  
  local_18 = init;
  local_10 = 0;
  local_20 = this;
  std::call_once<void(DeviceTy::*)(),DeviceTy*>
            (&this->InitFlag,(offset_in_DeviceTy_to_subr *)&local_18,&local_20);
  return -(this->IsInit ^ 1);
}

Assistant:

int32_t DeviceTy::initOnce() {
  std::call_once(InitFlag, &DeviceTy::init, this);

  // At this point, if IsInit is true, then either this thread or some other
  // thread in the past successfully initialized the device, so we can return
  // OFFLOAD_SUCCESS. If this thread executed init() via call_once() and it
  // failed, return OFFLOAD_FAIL. If call_once did not invoke init(), it means
  // that some other thread already attempted to execute init() and if IsInit
  // is still false, return OFFLOAD_FAIL.
  if (IsInit)
    return OFFLOAD_SUCCESS;
  else
    return OFFLOAD_FAIL;
}